

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

double __thiscall chrono::curiosity::Curiosity::GetRoverMass(Curiosity *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar9;
  long lVar10;
  long lVar11;
  double local_40;
  
  peVar5 = (this->m_chassis).
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar6 = (peVar5->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (peVar5->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_40 = *(double *)(peVar6 + 0x2e8);
  peVar8 = (this->m_diff_bar).
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar8->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar8->super_CuriosityPart).m_body.
            super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_40 = local_40 + *(double *)(peVar6 + 0x2e8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  lVar11 = -0x10;
  do {
    lVar9 = *(long *)((long)&(this->m_rockers)._M_elems[1].
                             super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar1 = *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar9 = *(long *)((long)&(this->m_bogies)._M_elems[1].
                             super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar2 = *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar9 = *(long *)((long)&(this->m_diff_links)._M_elems[1].
                             super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar3 = *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar9 = *(long *)((long)&(this->m_rocker_uprights)._M_elems[1].
                             super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar4 = *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar9 = *(long *)((long)&(this->m_bogie_uprights)._M_elems[1].
                             super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    local_40 = dVar1 + local_40 + dVar2 + dVar3 + dVar4 + *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 == 0);
  lVar11 = 0x20;
  do {
    lVar9 = *(long *)((long)((this->m_wheels)._M_elems + -2) + lVar11);
    lVar10 = *(long *)(lVar9 + 0x28);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    local_40 = local_40 + *(double *)(lVar10 + 0x2e8);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x80);
  return local_40;
}

Assistant:

double Curiosity::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass() + m_diff_bar->GetBody()->GetMass();
    for (int i = 0; i < 2; i++) {
        tot_mass = tot_mass + m_rockers[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogies[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_diff_links[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_rocker_uprights[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogie_uprights[i]->GetBody()->GetMass();
    }
    for (int i = 0; i < 6; i++) {
        tot_mass = tot_mass + m_wheels[i]->GetBody()->GetMass();
    }
    return tot_mass;
}